

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cpp
# Opt level: O2

bool __thiscall CBloomFilter::IsRelevantAndUpdate(CBloomFilter *this,CTransaction *tx)

{
  long lVar1;
  pointer pCVar2;
  pointer pCVar3;
  bool bVar4;
  byte bVar5;
  bool bVar6;
  TxoutType TVar7;
  CScript *pCVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  CScript *pCVar12;
  pointer outpoint;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vKey;
  Span<const_unsigned_char> vKey_00;
  Span<const_unsigned_char> vKey_01;
  bool local_b9;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  vSolutions;
  opcodetype opcode;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  const_iterator pc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data_1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = true;
  if ((this->vData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->vData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    vKey.m_data = &tx->hash;
    vKey.m_size = 0x20;
    local_b9 = contains(this,vKey);
    uVar11 = 0;
    while( true ) {
      pCVar2 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pCVar2) / 0x28) <= uVar11) break;
      pCVar12 = &pCVar2[uVar11].scriptPubKey;
      pc.ptr = (uchar *)pCVar12;
      if (0x1c < pCVar2[uVar11].scriptPubKey.super_CScriptBase._size) {
        pc.ptr = *(uchar **)&pCVar2[uVar11].scriptPubKey.super_CScriptBase._union;
      }
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      do {
        uVar10 = pCVar2[uVar11].scriptPubKey.super_CScriptBase._size;
        uVar9 = uVar10 - 0x1d;
        if (uVar10 < 0x1d) {
          uVar9 = uVar10;
        }
        pCVar8 = (CScript *)(pCVar12->super_CScriptBase)._union.indirect_contents.indirect;
        if (uVar10 < 0x1d) {
          pCVar8 = pCVar12;
        }
        if (((pCVar8->super_CScriptBase)._union.direct + (int)uVar9 <= pc.ptr) ||
           (bVar4 = CScript::GetOp(pCVar12,&pc,&opcode,
                                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                  ), !bVar4)) goto LAB_005724fc;
        vKey_00.m_size =
             (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
      } while ((vKey_00.m_size == 0) ||
              (vKey_00.m_data =
                    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start, bVar4 = contains(this,vKey_00), !bVar4));
      bVar5 = this->nFlags & 3;
      if (bVar5 == 2) {
        local_b9 = true;
        vSolutions.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        vSolutions.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vSolutions.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        TVar7 = Solver(pCVar12,&vSolutions);
        if ((TVar7 == MULTISIG) || (TVar7 == PUBKEY)) {
          data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               *(pointer *)((vKey.m_data)->m_wrapped).super_base_blob<256U>.m_data._M_elems;
          data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               *(pointer *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
          data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               *(pointer *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
          insert(this,(COutPoint *)&data_1);
        }
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~vector(&vSolutions);
      }
      else {
        local_b9 = true;
        if (bVar5 == 1) {
          data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               *(pointer *)((vKey.m_data)->m_wrapped).super_base_blob<256U>.m_data._M_elems;
          data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               *(pointer *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
          data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               *(pointer *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
          insert(this,(COutPoint *)&data_1);
        }
      }
LAB_005724fc:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      uVar11 = (ulong)((int)uVar11 + 1);
    }
    if (local_b9 == false) {
      outpoint = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pCVar3 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish;
      while ((bVar4 = outpoint != pCVar3, bVar4 &&
             (bVar6 = contains(this,&outpoint->prevout), !bVar6))) {
        pCVar12 = &outpoint->scriptSig;
        uVar10 = (outpoint->scriptSig).super_CScriptBase._size;
        pCVar8 = (CScript *)
                 (outpoint->scriptSig).super_CScriptBase._union.indirect_contents.indirect;
        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pCVar8;
        if (uVar10 < 0x1d) {
          data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pCVar12;
        }
        data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        while( true ) {
          uVar9 = uVar10 - 0x1d;
          if (uVar10 < 0x1d) {
            uVar9 = uVar10;
          }
          if (uVar10 < 0x1d) {
            pCVar8 = pCVar12;
          }
          if (((pCVar8->super_CScriptBase)._union.direct + (int)uVar9 <=
               data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start) ||
             (bVar4 = CScript::GetOp(pCVar12,(const_iterator *)&data,(opcodetype *)&vSolutions,
                                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     &data_1.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ), !bVar4)) break;
          vKey_01.m_size =
               (long)data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          if ((vKey_01.m_size != 0) &&
             (vKey_01.m_data =
                   data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start, bVar4 = contains(this,vKey_01), bVar4)) {
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
            goto LAB_005725f3;
          }
          uVar10 = (outpoint->scriptSig).super_CScriptBase._size;
          pCVar8 = (CScript *)
                   (outpoint->scriptSig).super_CScriptBase._union.indirect_contents.indirect;
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        outpoint = outpoint + 1;
      }
    }
    else {
LAB_005725f3:
      bVar4 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool CBloomFilter::IsRelevantAndUpdate(const CTransaction& tx)
{
    bool fFound = false;
    // Match if the filter contains the hash of tx
    //  for finding tx when they appear in a block
    if (vData.empty()) // zero-size = "match-all" filter
        return true;
    const Txid& hash = tx.GetHash();
    if (contains(hash.ToUint256()))
        fFound = true;

    for (unsigned int i = 0; i < tx.vout.size(); i++)
    {
        const CTxOut& txout = tx.vout[i];
        // Match if the filter contains any arbitrary script data element in any scriptPubKey in tx
        // If this matches, also add the specific output that was matched.
        // This means clients don't have to update the filter themselves when a new relevant tx
        // is discovered in order to find spending transactions, which avoids round-tripping and race conditions.
        CScript::const_iterator pc = txout.scriptPubKey.begin();
        std::vector<unsigned char> data;
        while (pc < txout.scriptPubKey.end())
        {
            opcodetype opcode;
            if (!txout.scriptPubKey.GetOp(pc, opcode, data))
                break;
            if (data.size() != 0 && contains(data))
            {
                fFound = true;
                if ((nFlags & BLOOM_UPDATE_MASK) == BLOOM_UPDATE_ALL)
                    insert(COutPoint(hash, i));
                else if ((nFlags & BLOOM_UPDATE_MASK) == BLOOM_UPDATE_P2PUBKEY_ONLY)
                {
                    std::vector<std::vector<unsigned char> > vSolutions;
                    TxoutType type = Solver(txout.scriptPubKey, vSolutions);
                    if (type == TxoutType::PUBKEY || type == TxoutType::MULTISIG) {
                        insert(COutPoint(hash, i));
                    }
                }
                break;
            }
        }
    }

    if (fFound)
        return true;

    for (const CTxIn& txin : tx.vin)
    {
        // Match if the filter contains an outpoint tx spends
        if (contains(txin.prevout))
            return true;

        // Match if the filter contains any arbitrary script data element in any scriptSig in tx
        CScript::const_iterator pc = txin.scriptSig.begin();
        std::vector<unsigned char> data;
        while (pc < txin.scriptSig.end())
        {
            opcodetype opcode;
            if (!txin.scriptSig.GetOp(pc, opcode, data))
                break;
            if (data.size() != 0 && contains(data))
                return true;
        }
    }

    return false;
}